

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O1

void DL::DataLisp_Internal::deleteNode(ValueNode *n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  if (n != (ValueNode *)0x0) {
    if (n->Type == VNT_Expression) {
      deleteNode((n->field_1)._Expression);
    }
    else if (n->Type == VNT_Statement) {
      deleteNode((n->field_1)._Statement);
    }
    pcVar2 = (n->_String)._M_dataplus._M_p;
    paVar1 = &(n->_String).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(n,0x30);
    return;
  }
  return;
}

Assistant:

static void deleteNode(ValueNode* n)
	{
		if (!n)
			return;

		if (n->Type == VNT_Statement)
			deleteNode(n->_Statement);
		else if (n->Type == VNT_Expression)
			deleteNode(n->_Expression);

		delete n;
	}